

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractor.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::ArrayFeatureExtractor::_InternalSerialize
          (ArrayFeatureExtractor *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  RepeatedField<unsigned_long> *this_00;
  LogMessage *other;
  unsigned_long *puVar4;
  byte *pbVar5;
  uint64_t uVar6;
  void *data;
  unsigned_long *puVar7;
  int byte_size;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  ArrayFeatureExtractor *this_local;
  memory_order __b;
  unsigned_long *end;
  unsigned_long *it;
  EpsCopyOutputStream *local_f0;
  EpsCopyOutputStream *local_b0;
  ulong local_a8;
  EpsCopyOutputStream *local_a0;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  byte *local_48;
  uint local_40;
  int local_3c;
  EpsCopyOutputStream *local_38;
  EpsCopyOutputStream *local_30;
  uint local_24;
  byte *local_20;
  uint local_14;
  byte *local_10;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = (this->_extractindex_cached_byte_size_).super___atomic_base<int>._M_i;
  stream_local = (EpsCopyOutputStream *)target;
  if (0 < (int)uVar1) {
    this_00 = _internal_extractindex(this);
    local_48 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    local_3c = 1;
    local_40 = 2;
    local_81 = 0;
    local_38 = stream;
    if (stream->end_ <= local_48) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      local_81 = 1;
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_80,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(local_95,other);
    }
    if ((local_81 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_80);
    }
    local_14 = local_3c << 3 | local_40;
    local_20 = local_48;
    *local_48 = (byte)local_14;
    if (local_14 < 0x80) {
      local_10 = local_48 + 1;
    }
    else {
      *local_48 = *local_48 | 0x80;
      local_14 = local_14 >> 7;
      local_48[1] = (byte)local_14;
      if (local_14 < 0x80) {
        local_10 = local_48 + 2;
      }
      else {
        local_20 = local_48 + 2;
        do {
          local_20[-1] = local_20[-1] | 0x80;
          local_14 = local_14 >> 7;
          *local_20 = (byte)local_14;
          local_20 = local_20 + 1;
          local_10 = local_20;
        } while (0x7f < local_14);
      }
    }
    local_30 = (EpsCopyOutputStream *)local_10;
    for (local_24 = uVar1; 0x7f < local_24; local_24 = local_24 >> 7) {
      *(byte *)local_30 = (byte)local_24 | 0x80;
      local_30 = (EpsCopyOutputStream *)((long)local_30 + 1);
    }
    local_f0 = (EpsCopyOutputStream *)((long)local_30 + 1);
    *(byte *)local_30 = (byte)local_24;
    local_30 = local_f0;
    puVar4 = google::protobuf::RepeatedField<unsigned_long>::data(this_00);
    iVar3 = google::protobuf::RepeatedField<unsigned_long>::size(this_00);
    end = puVar4;
    do {
      pbVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_f0);
      puVar7 = end + 1;
      uVar6 = google::protobuf::io::EpsCopyOutputStream::Encode64(*end);
      *pbVar5 = (byte)uVar6;
      if (uVar6 < 0x80) {
        local_a0 = (EpsCopyOutputStream *)(pbVar5 + 1);
      }
      else {
        *pbVar5 = *pbVar5 | 0x80;
        local_a8 = uVar6 >> 7;
        pbVar5[1] = (byte)local_a8;
        if (local_a8 < 0x80) {
          local_a0 = (EpsCopyOutputStream *)(pbVar5 + 2);
        }
        else {
          local_b0 = (EpsCopyOutputStream *)(pbVar5 + 2);
          do {
            local_b0[-1].field_0x3f = local_b0[-1].field_0x3f | 0x80;
            local_a8 = local_a8 >> 7;
            *(byte *)&local_b0->end_ = (byte)local_a8;
            local_b0 = (EpsCopyOutputStream *)((long)&local_b0->end_ + 1);
            local_a0 = local_b0;
          } while (0x7f < local_a8);
        }
      }
      local_f0 = local_a0;
      end = puVar7;
    } while (puVar7 < puVar4 + iVar3);
    stream_local = local_a0;
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar3 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar3,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* ArrayFeatureExtractor::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ArrayFeatureExtractor)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 extractIndex = 1;
  {
    int byte_size = _extractindex_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          1, _internal_extractindex(), byte_size, target);
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ArrayFeatureExtractor)
  return target;
}